

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
          (StringTree *__return_storage_ptr__,kj *this,char **params,char (*params_1) [7],
          String *params_2,char *params_3,String *params_4,char (*params_5) [3])

{
  char **value;
  char (*value_00) [7];
  String *pSVar1;
  char *value_01;
  char (*value_02) [3];
  StringTree *__return_storage_ptr___00;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  char local_69 [1];
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  String *local_38;
  String *params_local_4;
  char *params_local_3;
  String *params_local_2;
  char (*params_local_1) [7];
  char **params_local;
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = (String *)params_3;
  params_local_4 = params_2;
  params_local_3 = *params_1;
  params_local_2 = (String *)params;
  params_local_1 = (char (*) [7])this;
  params_local = (char **)__return_storage_ptr__;
  value = fwd<char_const*&>((char **)this);
  local_48 = _::toStringTreeOrCharSequence<char_const*&>(value);
  value_00 = ::const((char (*) [7])params_local_2);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[7]>(value_00);
  pSVar1 = fwd<kj::String&>((String *)params_local_3);
  local_68 = _::toStringTreeOrCharSequence<kj::String&>(pSVar1);
  value_01 = fwd<char>((NoInfer<char> *)params_local_4);
  local_69[0] = (char)_::toStringTreeOrCharSequence<char>(value_01);
  pSVar1 = fwd<kj::String&>(local_38);
  local_80 = _::toStringTreeOrCharSequence<kj::String&>(pSVar1);
  value_02 = ::const((char (*) [3])params_4);
  local_90 = _::toStringTreeOrCharSequence<char_const(&)[3]>(value_02);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr___00,(StringTree *)&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)local_69,(FixedArray<char,_1UL> *)&local_80,&local_90,
             (ArrayPtr<const_char> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}